

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_custom_secret_storage.cpp
# Opt level: O0

void __thiscall
TestSecretStorage::TestSecretStorage
          (TestSecretStorage *this,string *name_p,DatabaseInstance *db,TestSecretLog *logger_p,
          int64_t tie_break_offset_p)

{
  size_type in_RCX;
  DatabaseInstance *in_RDX;
  string *in_RDI;
  unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
  *in_stack_ffffffffffffffa8;
  DatabaseInstance *in_stack_ffffffffffffffb8;
  CatalogSetSecretStorage *in_stack_ffffffffffffffc0;
  
  duckdb::CatalogSetSecretStorage::CatalogSetSecretStorage
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,
             (int64_t)in_stack_ffffffffffffffa8);
  *(undefined ***)in_RDI = &PTR__TestSecretStorage_00a194c8;
  in_RDI[2].field_2._M_allocated_capacity = in_RCX;
  duckdb::Catalog::GetSystemCatalog(in_RDX);
  duckdb::make_uniq<duckdb::CatalogSet,duckdb::Catalog&>((Catalog *)in_RDX);
  duckdb::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator=
            ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true> *)in_RDI
             ,in_stack_ffffffffffffffa8);
  duckdb::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::~unique_ptr
            ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true> *)
             0x730c96);
  in_RDI[1].field_2._M_local_buf[0] = '\x01';
  *(undefined1 *)&in_RDI[2]._M_string_length = 1;
  return;
}

Assistant:

TestSecretStorage(const string &name_p, DatabaseInstance &db, TestSecretLog &logger_p, int64_t tie_break_offset_p)
	    : CatalogSetSecretStorage(db, name_p, tie_break_offset_p), logger(logger_p) {
		secrets = make_uniq<CatalogSet>(Catalog::GetSystemCatalog(db));
		persistent = true;
		include_in_lookups = true;
	}